

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode run_all_transfers(GlobalConfig *global,CURLSH *share,CURLcode result)

{
  byte *pbVar1;
  undefined8 uVar2;
  bool bVar3;
  CURLcode CVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  per_transfer *ppVar8;
  timediff_t tVar9;
  long lVar10;
  time_t tVar11;
  long lVar12;
  ulong uVar13;
  GlobalConfig *pGVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  bool bVar18;
  curltime cVar19;
  curltime newer;
  _Bool retry_1;
  _Bool skipped;
  _Bool added;
  _Bool retry;
  long delay_1;
  _Bool local_ad;
  uint local_ac;
  _Bool local_a8;
  undefined7 uStack_a7;
  CURLcode local_9c;
  _Bool local_98;
  undefined7 uStack_97;
  _Bool local_8c [4];
  GlobalConfig *local_88;
  CURLM *local_80;
  CURLSH *local_78;
  undefined8 local_70;
  int local_68;
  curltime local_60;
  _Bool local_50;
  _Bool local_4f;
  undefined2 local_4e;
  time_t local_48;
  int local_3c;
  time_t local_38;
  
  uVar13 = (ulong)result;
  uVar16 = *(ushort *)&global->field_0x63;
  uVar17 = (uint)uVar16;
  if (result == CURLE_OK) {
    if ((uVar16 & 1) == 0) {
      local_98 = false;
      local_a8 = false;
      CVar4 = create_transfer(global,share,&local_98,&local_a8);
      uVar13 = (ulong)CVar4;
      if (CVar4 == CURLE_OK) {
        if (local_98 == false) {
          errorf(global,"no transfer performed");
          uVar13 = 0x1a;
        }
        else {
          uVar13 = 0;
          ppVar8 = transfers;
          CVar4 = CURLE_OK;
          local_ac = (uint)uVar16;
          do {
            uVar16 = (ushort)uVar17;
            if (ppVar8 == (per_transfer *)0x0) break;
            cVar19 = curlx_now();
            local_38 = cVar19.tv_sec;
            local_3c = cVar19.tv_usec;
            if ((ppVar8->field_0x1d8 & 0x20) == 0) {
              local_9c = CVar4;
              CVar4 = pre_transfer(global,ppVar8);
              bVar3 = true;
              if ((CVar4 == CURLE_OK) &&
                 ((global->libcurl == (char *)0x0 || (CVar4 = easysrc_perform(), CVar4 == CURLE_OK))
                 )) {
                uVar5 = curl_easy_perform(ppVar8->curl);
                uVar13 = (ulong)uVar5;
                goto LAB_0011577a;
              }
              uVar13 = (ulong)CVar4;
            }
            else {
LAB_0011577a:
              local_9c = post_per_transfer(global,ppVar8,(CURLcode)uVar13,local_8c,(long *)&local_88
                                          );
              pGVar14 = local_88;
              if (local_8c[0] == true) {
LAB_001157a1:
                tool_go_sleep((long)pGVar14);
              }
              else {
                bVar18 = true;
                if (local_9c < CURLE_SETOPT_OPTION_SYNTAX) {
                  if ((0x1080008000004U >> ((ulong)local_9c & 0x3f) & 1) == 0) {
                    if ((ulong)local_9c != 0) goto LAB_0011585d;
                    goto LAB_00115867;
                  }
                }
                else {
LAB_0011585d:
                  if ((global->field_0x63 & 4) == 0) {
LAB_00115867:
                    do {
                      CVar4 = create_transfer(global,share,&local_98,&local_a8);
                      bVar18 = CVar4 != CURLE_OK;
                      if (bVar18) {
                        uVar13 = (ulong)CVar4;
                        local_9c = CVar4;
                        goto LAB_001157d1;
                      }
                    } while (local_a8 != false);
                    bVar18 = false;
                    uVar13 = 0;
                  }
                }
LAB_001157d1:
                ppVar8 = del_per_transfer(ppVar8);
                uVar17 = local_ac;
                bVar3 = true;
                if (bVar18) goto LAB_001157e9;
                if ((ppVar8 != (per_transfer *)0x0) && (global->ms_per_transfer != 0)) {
                  cVar19 = curlx_now();
                  newer._12_4_ = 0;
                  newer.tv_sec = SUB128(cVar19._0_12_,0);
                  newer.tv_usec = SUB124(cVar19._0_12_,8);
                  cVar19.tv_usec = local_3c;
                  cVar19.tv_sec = local_38;
                  cVar19._12_4_ = 0;
                  tVar9 = curlx_timediff(newer,cVar19);
                  if (tVar9 < global->ms_per_transfer) {
                    notef(global,"Transfer took %ld ms, waits %ldms as set by --rate",tVar9);
                    pGVar14 = (GlobalConfig *)(global->ms_per_transfer - tVar9);
                    goto LAB_001157a1;
                  }
                }
              }
              bVar3 = false;
            }
LAB_001157e9:
            uVar16 = (ushort)uVar17;
            CVar4 = local_9c;
          } while (!bVar3);
          if (CVar4 != CURLE_OK) {
            uVar13 = (ulong)CVar4;
          }
          if ((int)uVar13 != 0) {
            single_transfer_cleanup(global->current);
          }
        }
      }
    }
    else {
      local_70 = 0;
      local_68 = 1;
      local_78 = share;
      cVar19 = curlx_now();
      local_60.tv_sec = cVar19.tv_sec;
      local_60.tv_usec = cVar19.tv_usec;
      local_4e = 0;
      local_48 = time((time_t *)0x0);
      local_88 = global;
      local_80 = (CURLM *)curl_multi_init();
      if (local_80 == (CURLM *)0x0) {
        uVar13 = 0x1b;
      }
      else {
        CVar4 = add_parallel_transfers(global,local_80,local_78,&local_50,&local_4f);
        uVar13 = (ulong)CVar4;
        if (CVar4 == CURLE_OK) {
          if (all_added == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = 0;
            if ((int)local_70 == 0) {
              uVar15 = 0;
              local_ac = (uint)uVar16;
              do {
                uVar16 = (ushort)uVar17;
                if ((local_68 == 0) && (local_50 != true)) break;
                if ((char)local_4e == '\x01') {
                  if (local_68 == 0) break;
                  ppVar8 = transfers;
                  if (local_4e._1_1_ == '\0') {
                    for (; ppVar8 != (per_transfer *)0x0; ppVar8 = ppVar8->next) {
                      if ((ppVar8->field_0x1d8 & 8) != 0) {
                        ppVar8->field_0x1d8 = ppVar8->field_0x1d8 | 0x10;
                      }
                    }
                    local_4e = 0x101;
                  }
                }
                iVar6 = curl_multi_poll(local_80,0,0,1000,0);
                local_70 = CONCAT44(local_70._4_4_,iVar6);
                if (iVar6 == 0) {
                  uVar7 = curl_multi_perform(local_80);
                  local_70 = CONCAT44(local_70._4_4_,uVar7);
                }
                pGVar14 = local_88;
                if ((int)local_70 == 0) {
                  bVar3 = false;
                  progress_meter(local_88,&local_60,false);
                  uVar15 = 0;
                  do {
                    lVar10 = curl_multi_info_read();
                    if (lVar10 != 0) {
                      uVar2 = *(undefined8 *)(lVar10 + 8);
                      CVar4 = *(CURLcode *)(lVar10 + 0x10);
                      curl_easy_getinfo(uVar2,0x100015,&local_a8);
                      curl_multi_remove_handle(local_80,uVar2);
                      if ((((*(byte *)(CONCAT71(uStack_a7,local_a8) + 0x1d8) & 0x10) != 0) &&
                          (CVar4 == CURLE_ABORTED_BY_CALLBACK)) &&
                         (lVar12 = *(long *)(CONCAT71(uStack_a7,local_a8) + 0x1d0), lVar12 != 0)) {
                        curl_msnprintf(lVar12,0x100,
                                       "Transfer aborted due to critical error in another transfer")
                        ;
                      }
                      CVar4 = post_per_transfer(pGVar14,(per_transfer *)CONCAT71(uStack_a7,local_a8)
                                                ,CVar4,&local_ad,(long *)&local_98);
                      progress_finalize((per_transfer *)CONCAT71(uStack_a7,local_a8));
                      all_added = all_added + -1;
                      if (local_ad == true) {
                        pbVar1 = (byte *)(CONCAT71(uStack_a7,local_a8) + 0x1d8);
                        *pbVar1 = *pbVar1 & 0xf7;
                        lVar12 = CONCAT71(uStack_97,local_98);
                        if (lVar12 == 0) {
                          lVar12 = 0;
                        }
                        else {
                          tVar11 = time((time_t *)0x0);
                          lVar12 = lVar12 / 1000 + tVar11;
                        }
                        *(long *)(CONCAT71(uStack_a7,local_a8) + 0x188) = lVar12;
                      }
                      else {
                        if (CVar4 != CURLE_OK) {
                          if ((int)uVar15 == 0) {
                            uVar15 = (ulong)CVar4;
                          }
                          if ((*(byte *)(CONCAT71(uStack_a7,local_a8) + 0x1d8) & 0x10) == 0) {
                            uVar15 = (ulong)CVar4;
                          }
                        }
                        if ((uint)uVar15 < 0x31) {
                          if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_00115b80;
                          if (uVar15 != 0) goto LAB_00115bb2;
                        }
                        else {
LAB_00115bb2:
                          if ((pGVar14->field_0x63 & 4) != 0) {
LAB_00115b80:
                            local_4e = CONCAT11(local_4e._1_1_,1);
                          }
                        }
                        del_per_transfer((per_transfer *)CONCAT71(uStack_a7,local_a8));
                      }
                      bVar3 = true;
                    }
                  } while (lVar10 != 0);
                  uVar17 = local_ac;
                  if ((char)local_4e == '\0') {
                    if ((!bVar3) && (tVar11 = time((time_t *)0x0), local_48 != tVar11)) {
                      bVar3 = true;
                      local_48 = tVar11;
                    }
                    uVar17 = local_ac;
                    if (bVar3) {
                      CVar4 = add_parallel_transfers(pGVar14,local_80,local_78,&local_50,&local_4f);
                      if (CVar4 != CURLE_OK) {
                        uVar15 = (ulong)CVar4;
                      }
                      if (local_4f == true) {
                        local_68 = 1;
                      }
                    }
                    if ((uint)uVar15 < 0x31) {
                      if ((0x1080008000004U >> (uVar15 & 0x3f) & 1) == 0) {
                        if (uVar15 == 0) goto LAB_00115c45;
                        goto LAB_00115c5a;
                      }
                    }
                    else {
LAB_00115c5a:
                      if ((pGVar14->field_0x63 & 4) == 0) goto LAB_00115c45;
                    }
                    local_4e = CONCAT11(local_4e._1_1_,1);
                  }
                }
LAB_00115c45:
                uVar16 = (ushort)uVar17;
              } while ((int)local_70 == 0);
            }
            progress_meter(global,&local_60,true);
          }
          uVar13 = (ulong)((uint)((int)local_70 != 3) * 0x10 + 0x1b);
          if ((int)local_70 == 0) {
            uVar13 = uVar15;
          }
        }
        curl_multi_cleanup(local_80);
      }
    }
  }
  CVar4 = (CURLcode)uVar13;
  if (transfers != (per_transfer *)0x0) {
    ppVar8 = transfers;
    do {
      CVar4 = post_per_transfer(global,ppVar8,(CURLcode)uVar13,&local_98,(long *)&local_88);
      if ((CURLcode)uVar13 == CURLE_OK) {
        uVar13 = (ulong)CVar4;
      }
      CVar4 = (CURLcode)uVar13;
      clean_getout(ppVar8->config);
      ppVar8 = del_per_transfer(ppVar8);
    } while (ppVar8 != (per_transfer *)0x0);
  }
  *(ushort *)&global->field_0x63 = uVar16 & 0x600 | *(ushort *)&global->field_0x63 & 63999;
  return CVar4;
}

Assistant:

static CURLcode run_all_transfers(struct GlobalConfig *global,
                                  CURLSH *share,
                                  CURLcode result)
{
  /* Save the values of noprogress and isatty to restore them later on */
  bool orig_noprogress = global->noprogress;
  bool orig_isatty = global->isatty;
  struct per_transfer *per;

  /* Time to actually do the transfers */
  if(!result) {
    if(global->parallel)
      result = parallel_transfers(global, share);
    else
      result = serial_transfers(global, share);
  }

  /* cleanup if there are any left */
  for(per = transfers; per;) {
    bool retry;
    long delay;
    CURLcode result2 = post_per_transfer(global, per, result, &retry, &delay);
    if(!result)
      /* do not overwrite the original error */
      result = result2;

    /* Free list of given URLs */
    clean_getout(per->config);

    per = del_per_transfer(per);
  }

  /* Reset the global config variables */
  global->noprogress = orig_noprogress;
  global->isatty = orig_isatty;


  return result;
}